

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::StringTrieBuilder::FinalValueNode::operator==(FinalValueNode *this,Node *other)

{
  UBool UVar1;
  FinalValueNode *o;
  Node *other_local;
  FinalValueNode *this_local;
  
  if (this == (FinalValueNode *)other) {
    this_local._7_1_ = true;
  }
  else {
    UVar1 = Node::operator==(&this->super_Node,other);
    if (UVar1 == '\0') {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = this->value == *(int *)&other[1].super_UObject._vptr_UObject;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
StringTrieBuilder::FinalValueNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!Node::operator==(other)) {
        return FALSE;
    }
    const FinalValueNode &o=(const FinalValueNode &)other;
    return value==o.value;
}